

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O1

void __thiscall
moira::Moira::dasmBitImEa<(moira::Instr)30,(moira::Mode)7,(moira::Size)1>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  int iVar1;
  char *pcVar2;
  char cVar3;
  uint uVar4;
  char *pcVar5;
  long lVar6;
  Ea<(moira::Mode)7,_(moira::Size)1> dst;
  Ea<(moira::Mode)7,_(moira::Size)1> local_3c;
  
  *addr = *addr + 2;
  uVar4 = (*this->_vptr_Moira[5])();
  local_3c.reg = op & 7;
  local_3c.pc = *addr;
  *addr = local_3c.pc + 2;
  local_3c.ext1 = (*this->_vptr_Moira[5])(this);
  local_3c.ext1 = local_3c.ext1 & 0xffff;
  pcVar5 = "bclr";
  if (str->upper != false) {
    pcVar5 = "BCLR";
  }
  cVar3 = *pcVar5;
  while (cVar3 != '\0') {
    pcVar5 = pcVar5 + 1;
    pcVar2 = str->ptr;
    str->ptr = pcVar2 + 1;
    *pcVar2 = cVar3;
    cVar3 = *pcVar5;
  }
  iVar1 = (this->tab).raw;
  while (pcVar5 = str->ptr, pcVar5 < str->base + iVar1) {
    str->ptr = pcVar5 + 1;
    *pcVar5 = ' ';
  }
  pcVar5 = str->ptr;
  str->ptr = pcVar5 + 1;
  *pcVar5 = '#';
  StrWriter::operator<<(str,(UInt)(uVar4 & 0xff));
  cVar3 = ',';
  lVar6 = 0;
  do {
    pcVar5 = str->ptr;
    str->ptr = pcVar5 + 1;
    *pcVar5 = cVar3;
    cVar3 = "), "[lVar6 + 2];
    lVar6 = lVar6 + 1;
  } while (lVar6 != 2);
  StrWriter::operator<<(str,&local_3c);
  return;
}

Assistant:

void
Moira::dasmBitImEa(StrWriter &str, u32 &addr, u16 op)
{
    auto src = dasmRead<S>(addr);
    auto dst = Op <M,S> ( _____________xxx(op), addr );

    str << Ins<I>{} << tab << "#" << UInt(src) << ", " << dst;
}